

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_ce.cpp
# Opt level: O1

void msd_CE6(uchar **strings,size_t n)

{
  uint16_t *oracle;
  uchar **sorted;
  
  oracle = (uint16_t *)malloc(n * 2);
  sorted = (uchar **)malloc(n * 8);
  msd_CE6(strings,n,0,oracle,sorted);
  free(oracle);
  free(sorted);
  return;
}

Assistant:

void msd_CE6(unsigned char** strings, size_t n)
{
	uint16_t* restrict oracle = (uint16_t*)
		malloc(n*sizeof(uint16_t));
	unsigned char** sorted = (unsigned char**)
		malloc(n*sizeof(unsigned char*));
	msd_CE6(strings, n, 0, oracle, sorted);
	free(oracle);
	free(sorted);
}